

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool CreateSubMesh(ON_Mesh *mesh,ON_2fPointArray *tc,int nFis,int *pFis,ON_Mesh *subMeshOut)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ON_MeshFace *pOVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  ON_MeshFace *this;
  ulong uVar8;
  long lVar9;
  int sourceVi;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  vmap;
  int local_76c;
  int *local_768;
  ON_SimpleArray<ON_3fVector> *local_760;
  ulong local_758;
  ON_SimpleArray<ON_MeshFace> *local_750;
  ulong local_748;
  ON_SimpleArray<ON_3fVector> *local_740;
  ON_SimpleArray<ON_3dPoint> *local_738;
  ON_SimpleArray<ON_2fPoint> *local_730;
  ON_SimpleArray<ON_3fPoint> *local_728;
  ON_Mesh *local_720;
  ON_2fPointArray *local_718;
  ON_Mesh local_710;
  
  if ((pFis == (int *)0x0 || nFis == 0) ||
     (iVar1 = (tc->super_ON_SimpleArray<ON_2fPoint>).m_count, local_768 = pFis, local_718 = tc,
     iVar4 = ON_Mesh::VertexCount(mesh), iVar1 != iVar4)) {
    bVar2 = false;
  }
  else {
    uVar8 = 0;
    ON_Mesh::ON_Mesh(&local_710,nFis,0,false,false);
    ON_Mesh::operator=(subMeshOut,&local_710);
    ON_Mesh::~ON_Mesh(&local_710);
    local_710.super_ON_Geometry.super_ON_Object._vptr_ON_Object =
         (_func_int **)&local_710.m_V.super_ON_SimpleArray<ON_3fPoint>.m_a;
    local_710.super_ON_Geometry.super_ON_Object.m_userdata_list = (ON_UserData *)0x1;
    local_710.m_dV.super_ON_SimpleArray<ON_3dPoint>._vptr_ON_SimpleArray = (_func_int **)0x0;
    local_710.m_dV.super_ON_SimpleArray<ON_3dPoint>.m_a = (ON_3dPoint *)0x0;
    local_710.m_dV.super_ON_SimpleArray<ON_3dPoint>.m_count = 0x3f800000;
    local_710.m_V.super_ON_SimpleArray<ON_3fPoint>._vptr_ON_SimpleArray = (_func_int **)0x0;
    local_710.m_V.super_ON_SimpleArray<ON_3fPoint>.m_a = (ON_3fPoint *)0x0;
    local_750 = &subMeshOut->m_F;
    local_728 = &(subMeshOut->m_V).super_ON_SimpleArray<ON_3fPoint>;
    local_738 = &(subMeshOut->m_dV).super_ON_SimpleArray<ON_3dPoint>;
    local_740 = &(subMeshOut->m_N).super_ON_SimpleArray<ON_3fVector>;
    local_730 = &(subMeshOut->m_T).super_ON_SimpleArray<ON_2fPoint>;
    local_760 = &(subMeshOut->m_FN).super_ON_SimpleArray<ON_3fVector>;
    local_758 = (ulong)(uint)nFis;
    local_720 = subMeshOut;
    if (nFis < 1) {
      local_758 = uVar8;
    }
    for (; uVar8 != local_758; uVar8 = uVar8 + 1) {
      this = (mesh->m_F).m_a + local_768[uVar8];
      pOVar5 = ON_SimpleArray<ON_MeshFace>::AppendNew(local_750);
      bVar2 = ON_MeshFace::IsQuad(this);
      local_748 = uVar8;
      for (lVar9 = 0; (ulong)bVar2 + 3 != lVar9; lVar9 = lVar9 + 1) {
        local_76c = this->vi[lVar9];
        iVar6 = std::
                _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)&local_710,&local_76c);
        if (iVar6.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur ==
            (__node_type *)0x0) {
          iVar1 = (local_720->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
          pOVar5->vi[lVar9] = iVar1;
          pmVar7 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_710,&local_76c);
          *pmVar7 = iVar1;
          ON_SimpleArray<ON_3fPoint>::Append
                    (local_728,(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + local_76c);
          bVar3 = ON_Mesh::HasDoublePrecisionVertices(mesh);
          if (bVar3) {
            ON_SimpleArray<ON_3dPoint>::Append
                      (local_738,(mesh->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a + local_76c);
          }
          bVar3 = ON_Mesh::HasVertexNormals(mesh);
          if (bVar3) {
            ON_SimpleArray<ON_3fVector>::Append
                      (local_740,(mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_a + local_76c);
          }
          ON_SimpleArray<ON_2fPoint>::Append
                    (local_730,(local_718->super_ON_SimpleArray<ON_2fPoint>).m_a + local_76c);
        }
        else {
          pOVar5->vi[lVar9] =
               *(int *)((long)iVar6.super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                              _M_cur + 0xc);
        }
        if (!bVar2) {
          pOVar5->vi[3] = pOVar5->vi[2];
        }
      }
      bVar2 = ON_Mesh::HasFaceNormals(mesh);
      uVar8 = local_748;
      if (bVar2) {
        ON_SimpleArray<ON_3fVector>::Append
                  (local_760,
                   (mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a + local_768[local_748]);
      }
    }
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&local_710);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool CreateSubMesh(const ON_Mesh& mesh, const ON_2fPointArray& tc, const int nFis, const int* pFis, ON_Mesh& subMeshOut)
{
  if (nFis == 0 || pFis == nullptr)
    return false;
  if (tc.Count() != mesh.VertexCount())
    return false;

  subMeshOut = ON_Mesh(nFis, 0, 0, 0);
  std::unordered_map<int, int> vmap;
  for (int i = 0; i < nFis; i++)
  {
    const ON_MeshFace& sourceFace = mesh.m_F[pFis[i]];
    ON_MeshFace& targetFace = subMeshOut.m_F.AppendNew();
    const int fvc = sourceFace.IsQuad() ? 4 : 3;
    for (int fvi = 0; fvi < fvc; fvi++)
    {
      const int sourceVi = sourceFace.vi[fvi];
      const auto vmapit = vmap.find(sourceVi);
      if (vmapit == vmap.end())
      {
        const int targetVi = subMeshOut.m_V.Count();
        targetFace.vi[fvi] = targetVi;
        vmap[sourceVi] = targetVi;
        subMeshOut.m_V.Append(mesh.m_V[sourceVi]);
        if (mesh.HasDoublePrecisionVertices())
          subMeshOut.m_dV.Append(mesh.m_dV[sourceVi]);
        if (mesh.HasVertexNormals())
          subMeshOut.m_N.Append(mesh.m_N[sourceVi]);
        subMeshOut.m_T.Append(tc[sourceVi]);
      }
      else
      {
        const int targetVi = vmapit->second;
        targetFace.vi[fvi] = targetVi;
      }
      if (fvc == 3)
        targetFace.vi[3] = targetFace.vi[2];
    }
    if (mesh.HasFaceNormals())
      subMeshOut.m_FN.Append(mesh.m_FN[pFis[i]]);
  }
  return true;
}